

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall
GraphTestDyndepLoadOutputWithMultipleRules2::Run(GraphTestDyndepLoadOutputWithMultipleRules2 *this)

{
  VirtualFileSystem *this_00;
  DependencyScan *this_01;
  Test *pTVar1;
  bool bVar2;
  Node *pNVar3;
  string err;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild out1: r in1 || dd1\n  dyndep = dd1\nbuild out2: r in2 || dd2\n  dyndep = dd2\n"
              ,(ManifestParserOptions)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"dd1",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"ninja_dyndep_version = 1\nbuild out1 | out-twice.imp: dyndep\n",
             &local_69);
  this_00 = &(this->super_GraphTest).fs_;
  VirtualFileSystem::Create(this_00,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"dd2",&local_6a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"ninja_dyndep_version = 1\nbuild out2 | out-twice.imp: dyndep\n",
             &local_69);
  VirtualFileSystem::Create(this_00,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  pTVar1 = g_current_test;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd1",&local_6a);
  pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
  bVar2 = testing::Test::Check
                    (pTVar1,pNVar3->dyndep_pending_,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x25c,"GetNode(\"dd1\")->dyndep_pending()");
  std::__cxx11::string::~string((string *)&local_68);
  pTVar1 = g_current_test;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd1",&local_6a);
    pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
    this_01 = &(this->super_GraphTest).scan_;
    bVar2 = DependencyScan::LoadDyndeps(this_01,pNVar3,&local_48);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x25d,"scan_.LoadDyndeps(GetNode(\"dd1\"), &err)");
    std::__cxx11::string::~string((string *)&local_68);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",&local_48);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x25e,"\"\" == err");
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd2",&local_6a);
    pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
    bVar2 = testing::Test::Check
                      (pTVar1,pNVar3->dyndep_pending_,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x25f,"GetNode(\"dd2\")->dyndep_pending()");
    std::__cxx11::string::~string((string *)&local_68);
    pTVar1 = g_current_test;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"dd2",&local_6a);
      pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_68);
      bVar2 = DependencyScan::LoadDyndeps(this_01,pNVar3,&local_48);
      testing::Test::Check
                (pTVar1,!bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0x260,"scan_.LoadDyndeps(GetNode(\"dd2\"), &err)");
      std::__cxx11::string::~string((string *)&local_68);
      pTVar1 = g_current_test;
      bVar2 = std::operator==("multiple rules generate out-twice.imp",&local_48);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0x261,"\"multiple rules generate out-twice.imp\" == err");
      goto LAB_00152a8d;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00152a8d:
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

TEST_F(GraphTest, DyndepLoadOutputWithMultipleRules2) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out1: r in1 || dd1\n"
"  dyndep = dd1\n"
"build out2: r in2 || dd2\n"
"  dyndep = dd2\n"
  );
  fs_.Create("dd1",
"ninja_dyndep_version = 1\n"
"build out1 | out-twice.imp: dyndep\n"
  );
  fs_.Create("dd2",
"ninja_dyndep_version = 1\n"
"build out2 | out-twice.imp: dyndep\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd1")->dyndep_pending());
  EXPECT_TRUE(scan_.LoadDyndeps(GetNode("dd1"), &err));
  EXPECT_EQ("", err);
  ASSERT_TRUE(GetNode("dd2")->dyndep_pending());
  EXPECT_FALSE(scan_.LoadDyndeps(GetNode("dd2"), &err));
  EXPECT_EQ("multiple rules generate out-twice.imp", err);
}